

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_entry *
new_entry(stumpless_facility facility,stumpless_severity severity,char *app_name,char *msgid,
         char *message,size_t message_length)

{
  stumpless_entry *entry;
  stumpless_entry *psVar1;
  
  if ((entry_cache == (cache *)0x0) &&
     (entry_cache = cache_new(0x238,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0),
     entry_cache == (cache *)0x0)) {
    return (stumpless_entry *)0x0;
  }
  entry = (stumpless_entry *)cache_alloc(entry_cache);
  if (entry == (stumpless_entry *)0x0) {
    psVar1 = (stumpless_entry *)0x0;
  }
  else {
    clear_error();
    psVar1 = unchecked_load_entry(entry,facility,severity,app_name,msgid,message,message_length);
    if (psVar1 == (stumpless_entry *)0x0) {
      cache_free(entry_cache,entry);
    }
  }
  return psVar1;
}

Assistant:

struct stumpless_entry *
new_entry( enum stumpless_facility facility,
           enum stumpless_severity severity,
           const char *app_name,
           const char *msgid,
           char *message,
           size_t message_length ) {
  struct stumpless_entry *entry;
  struct stumpless_entry *result;

  if( unlikely( !entry_cache ) ) {
    entry_cache = cache_new( sizeof( *entry ), NULL, NULL );
    if( !entry_cache ) {
      return NULL;
    }
  }

  entry = cache_alloc( entry_cache );
  if( unlikely( !entry ) ) {
    return NULL;
  }

  clear_error(  );

  result = unchecked_load_entry( entry,
                                 facility,
                                 severity,
                                 app_name,
                                 msgid,
                                 message,
                                 message_length );

  if( !result ) {
    cache_free( entry_cache, entry );
  }

  return result;
}